

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O0

bool vkt::sparse::anon_unknown_0::imageHasErrorPixels(ConstPixelBufferAccess *image)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  undefined1 local_50 [8];
  Vec4 color;
  int x;
  int y;
  Vec4 blankColor;
  Vec4 errorColor;
  ConstPixelBufferAccess *image_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(blankColor.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&x);
  color.m_data[3] = 0.0;
  do {
    fVar1 = color.m_data[3];
    iVar3 = tcu::ConstPixelBufferAccess::getHeight(image);
    if (iVar3 <= (int)fVar1) {
      return false;
    }
    for (color.m_data[2] = 0.0; fVar1 = color.m_data[2],
        iVar3 = tcu::ConstPixelBufferAccess::getWidth(image), (int)fVar1 < iVar3;
        color.m_data[2] = (float)((int)color.m_data[2] + 1)) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_50,(int)image,(int)color.m_data[2],
                 (int)color.m_data[3]);
      bVar2 = tcu::Vector<float,_4>::operator==
                        ((Vector<float,_4> *)local_50,(Vector<float,_4> *)(blankColor.m_data + 2));
      if ((bVar2) ||
         (bVar2 = tcu::Vector<float,_4>::operator==
                            ((Vector<float,_4> *)local_50,(Vector<float,_4> *)&x), bVar2)) {
        return true;
      }
    }
    color.m_data[3] = (float)((int)color.m_data[3] + 1);
  } while( true );
}

Assistant:

bool imageHasErrorPixels (const tcu::ConstPixelBufferAccess image)
{
	const Vec4 errorColor	= Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	const Vec4 blankColor	= Vec4();

	for (int y = 0; y < image.getHeight(); ++y)
	for (int x = 0; x < image.getWidth(); ++x)
	{
		const Vec4 color = image.getPixel(x, y);
		if (color == errorColor || color == blankColor)
			return true;
	}

	return false;
}